

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::csv::
basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::visit_begin_array(basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *this,semantic_tag param_1,ser_context *param_2,error_code *ec)

{
  pointer psVar1;
  pointer psVar2;
  pointer pcVar3;
  csv_errc __e;
  pointer pbVar4;
  vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::string_sink<std::__cxx11::string>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::string_sink<std::__cxx11::string>,std::allocator<char>>::stack_item>>
  *this_00;
  unsigned_long value;
  string_type str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  error_code *local_58;
  vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::string_sink<std::__cxx11::string>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::string_sink<std::__cxx11::string>,std::allocator<char>>::stack_item>>
  *local_50;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  pointer local_38;
  
  this_00 = (vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::string_sink<std::__cxx11::string>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::string_sink<std::__cxx11::string>,std::allocator<char>>::stack_item>>
             *)&this->stack_;
  psVar1 = (this->stack_).
           super__Vector_base<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == psVar2) {
    if (this->flat_ == true) {
      local_98._M_dataplus._M_p = (pointer)((ulong)local_98._M_dataplus._M_p._4_4_ << 0x20);
    }
    else {
      local_98._M_dataplus._M_p._0_4_ = 1;
    }
    goto LAB_00322224;
  }
  if ((ulong)(((long)psVar2 - (long)psVar1 >> 4) * -0x5555555555555555) < this->max_nesting_depth_)
  {
    if (((this->has_column_names_ == true) && (psVar2[-1].count_ == 0)) &&
       (psVar2[-1].item_kind_ < flat_object)) {
      pbVar4 = (this->column_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (this->column_names_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = ec;
      local_50 = this_00;
      if (pbVar4 != local_38) {
        local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->column_paths_;
        local_48 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->column_path_value_map_;
        value = 0;
        do {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          local_98._M_string_length = 0;
          local_98.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::push_back((char)&local_98);
          jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>(value,&local_98);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>(local_40,&local_98);
          local_70 = 0;
          local_68 = 0;
          local_78 = &local_68;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string&,std::__cxx11::string>(local_48,&local_98,&local_78);
          if (local_78 != &local_68) {
            operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
          }
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string,std::__cxx11::string_const&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->column_path_name_map_,&local_98,pbVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          pbVar4 = pbVar4 + 1;
          value = value + 1;
        } while (pbVar4 != local_38);
      }
      this->has_column_mapping_ = true;
      ec = local_58;
      this_00 = local_50;
    }
    psVar1 = (this->stack_).
             super__Vector_base<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    switch(psVar1[-1].item_kind_) {
    case flat_row_mapping:
      if (this->has_column_mapping_ == true) {
        local_98._M_dataplus._M_p._0_4_ = 3;
      }
      else {
        local_98._M_dataplus._M_p._0_4_ = 4;
      }
      break;
    case row_mapping:
    case row:
      local_98._M_dataplus._M_p._0_4_ = 7;
      break;
    case flat_object:
      if (this->subfield_delimiter_ == '\0') goto switchD_0032206b_caseD_5;
      if ((*(long *)(*(long *)this_00 + 8) == 0) && (this->has_column_mapping_ == false)) {
        pcVar3 = psVar1[-1].column_path_._M_dataplus._M_p;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar3,pcVar3 + psVar1[-1].column_path_._M_string_length);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->column_paths_,&local_98);
        local_70 = 0;
        local_68 = 0;
        local_78 = &local_68;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string,std::__cxx11::string>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->column_path_value_map_,&local_98,&local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
      }
LAB_003221fb:
      (this->value_buffer_)._M_string_length = 0;
      *(this->value_buffer_)._M_dataplus._M_p = '\0';
      local_98._M_dataplus._M_p._0_4_ = 10;
      break;
    case flat_row:
      if (this->subfield_delimiter_ != '\0') {
        append_array_path_component(this);
        goto LAB_003221fb;
      }
    case unmapped:
    case multivalued_field:
    case stream_multivalued_field:
    case column_multivalued_field:
switchD_0032206b_caseD_5:
      local_98._M_dataplus._M_p._0_4_ = 5;
      break;
    case stream_flat_row:
      if (this->subfield_delimiter_ == '\0') goto switchD_0032206b_caseD_5;
      (this->value_buffer_)._M_string_length = 0;
      *(this->value_buffer_)._M_dataplus._M_p = '\0';
      local_98._M_dataplus._M_p._0_4_ = 0xb;
      break;
    case object:
      local_98._M_dataplus._M_p._0_4_ = 6;
      break;
    case column_mapping:
      local_98._M_dataplus._M_p._0_4_ = 9;
      break;
    case column:
      (this->value_buffer_)._M_string_length = 0;
      *(this->value_buffer_)._M_dataplus._M_p = '\0';
      local_98._M_dataplus._M_p._0_4_ = 0xc;
      break;
    default:
      __e = source_error;
      goto LAB_003221d6;
    }
LAB_00322224:
    std::
    vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::string_sink<std::__cxx11::string>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::string_sink<std::__cxx11::string>,std::allocator<char>>::stack_item>>
    ::
    emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::string_sink<std::__cxx11::string>,std::allocator<char>>::stack_item_kind>
              (this_00,(stack_item_kind *)&local_98);
  }
  else {
    __e = max_nesting_depth_exceeded;
LAB_003221d6:
    std::error_code::operator=(ec,__e);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_array(semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (stack_.empty())
        {
            if (flat_)
            {
                stack_.emplace_back(stack_item_kind::flat_row_mapping);
            }
            else
            {
                stack_.emplace_back(stack_item_kind::row_mapping);
            }
            JSONCONS_VISITOR_RETURN;
        }
        if (JSONCONS_UNLIKELY(stack_.size() >= max_nesting_depth_))
        {
            ec = csv_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        }
        // legacy        
        if (has_column_names_ && stack_.back().count_ == 0)
        {
            if (stack_.back().item_kind_ == stack_item_kind::flat_row_mapping || stack_.back().item_kind_ == stack_item_kind::row_mapping)
            {
                std::size_t index = 0;
                for (const auto& item : column_names_)
                {
                    string_type str{alloc_};
                    str.push_back('/');
                    jsoncons::detail::from_integer(index, str);
                    column_paths_.emplace_back(str);
                    column_path_value_map_.emplace(str, string_type{alloc_});
                    column_path_name_map_.emplace(std::move(str), item);
                    ++index;
                }
                has_column_mapping_ = true;
            }
        }
        
        switch (stack_.back().item_kind_)
        {
            case stack_item_kind::flat_row_mapping:
                if (has_column_mapping_)
                {
                    stack_.emplace_back(stack_item_kind::flat_row);
                }
                else
                {
                    stack_.emplace_back(stack_item_kind::stream_flat_row);
                }
                break;
            case stack_item_kind::row_mapping:
                stack_.emplace_back(stack_item_kind::row);
                break;
            case stack_item_kind::object:
                stack_.emplace_back(stack_item_kind::object);
                break;
            case stack_item_kind::row:
                stack_.emplace_back(stack_item_kind::row);
                break;
            case stack_item_kind::flat_row:
                if (subfield_delimiter_ == char_type())
                {
                    stack_.emplace_back(stack_item_kind::unmapped);
                }
                else
                {
                    append_array_path_component();
                    value_buffer_.clear();
                    stack_.emplace_back(stack_item_kind::multivalued_field);
                }
                break;
            case stack_item_kind::stream_flat_row:
                if (subfield_delimiter_ == char_type())
                {
                    stack_.emplace_back(stack_item_kind::unmapped);
                }
                else
                {
                    value_buffer_.clear();
                    stack_.emplace_back(stack_item_kind::stream_multivalued_field);
                }
                break;
            case stack_item_kind::flat_object:
                if (subfield_delimiter_ == char_type())
                {
                    stack_.emplace_back(stack_item_kind::unmapped);
                }
                else
                {
                    if (stack_[0].count_ == 0)
                    {
                        if (!has_column_mapping_)
                        {
                            string_type str = stack_.back().column_path_;
                            column_paths_.emplace_back(str);
                            column_path_value_map_.emplace(std::move(str), string_type{alloc_});
                        }
                    }
                    
                    value_buffer_.clear();
                    stack_.emplace_back(stack_item_kind::multivalued_field);
                }
                break;
            case stack_item_kind::multivalued_field:
            case stack_item_kind::stream_multivalued_field:
                stack_.emplace_back(stack_item_kind::unmapped);
                break;
            case stack_item_kind::column_mapping:
                stack_.emplace_back(stack_item_kind::column);
                break;
            case stack_item_kind::column:
            {
                value_buffer_.clear();
                stack_.emplace_back(stack_item_kind::column_multivalued_field);
                break;
            }
            case stack_item_kind::column_multivalued_field:
                stack_.emplace_back(stack_item_kind::unmapped);
                break;
            case stack_item_kind::unmapped:
                stack_.emplace_back(stack_item_kind::unmapped);
                break;
            default: // error
                //std::cout << "visit_begin_array " << (int)stack_.back().item_kind_ << "\n"; 
                ec = csv_errc::source_error;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }